

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateMapGetters
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  JavaType JVar2;
  FieldDescriptor *field;
  FileDescriptor *descriptor;
  Printer *printer_local;
  ImmutableMapFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$\npublic int get$capitalized_name$Count() {\n  return internalGet$capitalized_name$().getMap().size();\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$\npublic boolean contains$capitalized_name$(\n    $key_type$ key) {\n  $key_null_check$\n  return internalGet$capitalized_name$().getMap().containsKey(key);\n}\n"
                    );
  field = anon_unknown_5::ValueField(this->descriptor_);
  JVar2 = GetJavaType(field);
  if (JVar2 == JAVATYPE_ENUM) {
    io::Printer::Print(printer,&this->variables_,
                       "/**\n * Use {@link #get$capitalized_name$Map()} instead.\n */\n@java.lang.Deprecated\npublic java.util.Map<$boxed_key_type$, $value_enum_type$>\nget$capitalized_name$() {\n  return get$capitalized_name$Map();\n}\n"
                      );
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "$deprecation$\npublic java.util.Map<$boxed_key_type$, $value_enum_type$>\nget$capitalized_name$Map() {\n  return internalGetAdapted$capitalized_name$Map(\n      internalGet$capitalized_name$().getMap());}\n"
                      );
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "$deprecation$\npublic $value_enum_type$ get$capitalized_name$OrDefault(\n    $key_type$ key,\n    $value_enum_type$ defaultValue) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$().getMap();\n  return map.containsKey(key)\n         ? $name$ValueConverter.doForward(map.get(key))\n         : defaultValue;\n}\n"
                      );
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "$deprecation$\npublic $value_enum_type$ get$capitalized_name$OrThrow(\n    $key_type$ key) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$().getMap();\n  if (!map.containsKey(key)) {\n    throw new java.lang.IllegalArgumentException();\n  }\n  return $name$ValueConverter.doForward(map.get(key));\n}\n"
                      );
    descriptor = FieldDescriptor::file(this->descriptor_);
    bVar1 = SupportUnknownEnumValue(descriptor);
    if (bVar1) {
      io::Printer::Print(printer,&this->variables_,
                         "/**\n * Use {@link #get$capitalized_name$ValueMap()} instead.\n */\n@java.lang.Deprecated\npublic java.util.Map<$boxed_key_type$, $boxed_value_type$>\nget$capitalized_name$Value() {\n  return get$capitalized_name$ValueMap();\n}\n"
                        );
      WriteFieldDocComment(printer,this->descriptor_);
      io::Printer::Print(printer,&this->variables_,
                         "$deprecation$\npublic java.util.Map<$boxed_key_type$, $boxed_value_type$>\nget$capitalized_name$ValueMap() {\n  return internalGet$capitalized_name$().getMap();\n}\n"
                        );
      WriteFieldDocComment(printer,this->descriptor_);
      io::Printer::Print(printer,&this->variables_,
                         "$deprecation$\npublic $value_type$ get$capitalized_name$ValueOrDefault(\n    $key_type$ key,\n    $value_type$ defaultValue) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$().getMap();\n  return map.containsKey(key) ? map.get(key) : defaultValue;\n}\n"
                        );
      WriteFieldDocComment(printer,this->descriptor_);
      io::Printer::Print(printer,&this->variables_,
                         "$deprecation$\npublic $value_type$ get$capitalized_name$ValueOrThrow(\n    $key_type$ key) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$().getMap();\n  if (!map.containsKey(key)) {\n    throw new java.lang.IllegalArgumentException();\n  }\n  return map.get(key);\n}\n"
                        );
    }
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "/**\n * Use {@link #get$capitalized_name$Map()} instead.\n */\n@java.lang.Deprecated\npublic java.util.Map<$type_parameters$> get$capitalized_name$() {\n  return get$capitalized_name$Map();\n}\n"
                      );
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "$deprecation$\npublic java.util.Map<$type_parameters$> get$capitalized_name$Map() {\n  return internalGet$capitalized_name$().getMap();\n}\n"
                      );
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "$deprecation$\npublic $value_type$ get$capitalized_name$OrDefault(\n    $key_type$ key,\n    $value_type$ defaultValue) {\n  $key_null_check$\n  java.util.Map<$type_parameters$> map =\n      internalGet$capitalized_name$().getMap();\n  return map.containsKey(key) ? map.get(key) : defaultValue;\n}\n"
                      );
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "$deprecation$\npublic $value_type$ get$capitalized_name$OrThrow(\n    $key_type$ key) {\n  $key_null_check$\n  java.util.Map<$type_parameters$> map =\n      internalGet$capitalized_name$().getMap();\n  if (!map.containsKey(key)) {\n    throw new java.lang.IllegalArgumentException();\n  }\n  return map.get(key);\n}\n"
                      );
  }
  return;
}

Assistant:

void ImmutableMapFieldGenerator::
GenerateMapGetters(io::Printer* printer) const {
  printer->Print(
      variables_,
      "$deprecation$\n"
      "public int get$capitalized_name$Count() {\n"
      "  return internalGet$capitalized_name$().getMap().size();\n"
      "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(
      variables_,
      "$deprecation$\n"
      "public boolean contains$capitalized_name$(\n"
      "    $key_type$ key) {\n"
      "  $key_null_check$\n"
      "  return internalGet$capitalized_name$().getMap().containsKey(key);\n"
      "}\n");
  if (GetJavaType(ValueField(descriptor_)) == JAVATYPE_ENUM) {
    printer->Print(
        variables_,
        "/**\n"
        " * Use {@link #get$capitalized_name$Map()} instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
        "get$capitalized_name$() {\n"
        "  return get$capitalized_name$Map();\n"
        "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
                   "$deprecation$\n"
                   "public java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
                   "get$capitalized_name$Map() {\n"
                   "  return internalGetAdapted$capitalized_name$Map(\n"
                   "      internalGet$capitalized_name$().getMap());"
                   "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "$deprecation$\n"
        "public $value_enum_type$ get$capitalized_name$OrDefault(\n"
        "    $key_type$ key,\n"
        "    $value_enum_type$ defaultValue) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
        "      internalGet$capitalized_name$().getMap();\n"
        "  return map.containsKey(key)\n"
        "         ? $name$ValueConverter.doForward(map.get(key))\n"
        "         : defaultValue;\n"
        "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "$deprecation$\n"
        "public $value_enum_type$ get$capitalized_name$OrThrow(\n"
        "    $key_type$ key) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
        "      internalGet$capitalized_name$().getMap();\n"
        "  if (!map.containsKey(key)) {\n"
        "    throw new java.lang.IllegalArgumentException();\n"
        "  }\n"
        "  return $name$ValueConverter.doForward(map.get(key));\n"
        "}\n");
    if (SupportUnknownEnumValue(descriptor_->file())) {
      printer->Print(
          variables_,
          "/**\n"
          " * Use {@link #get$capitalized_name$ValueMap()} instead.\n"
          " */\n"
          "@java.lang.Deprecated\n"
          "public java.util.Map<$boxed_key_type$, $boxed_value_type$>\n"
          "get$capitalized_name$Value() {\n"
          "  return get$capitalized_name$ValueMap();\n"
          "}\n");
      WriteFieldDocComment(printer, descriptor_);
      printer->Print(
          variables_,
          "$deprecation$\n"
          "public java.util.Map<$boxed_key_type$, $boxed_value_type$>\n"
          "get$capitalized_name$ValueMap() {\n"
          "  return internalGet$capitalized_name$().getMap();\n"
          "}\n");
      WriteFieldDocComment(printer, descriptor_);
      printer->Print(
          variables_,
          "$deprecation$\n"
          "public $value_type$ get$capitalized_name$ValueOrDefault(\n"
          "    $key_type$ key,\n"
          "    $value_type$ defaultValue) {\n"
          "  $key_null_check$\n"
          "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
          "      internalGet$capitalized_name$().getMap();\n"
          "  return map.containsKey(key) ? map.get(key) : defaultValue;\n"
          "}\n");
      WriteFieldDocComment(printer, descriptor_);
      printer->Print(
          variables_,
          "$deprecation$\n"
          "public $value_type$ get$capitalized_name$ValueOrThrow(\n"
          "    $key_type$ key) {\n"
          "  $key_null_check$\n"
          "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
          "      internalGet$capitalized_name$().getMap();\n"
          "  if (!map.containsKey(key)) {\n"
          "    throw new java.lang.IllegalArgumentException();\n"
          "  }\n"
          "  return map.get(key);\n"
          "}\n");
    }
  } else {
    printer->Print(
        variables_,
        "/**\n"
        " * Use {@link #get$capitalized_name$Map()} instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public java.util.Map<$type_parameters$> get$capitalized_name$() {\n"
        "  return get$capitalized_name$Map();\n"
        "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "$deprecation$\n"
        "public java.util.Map<$type_parameters$> get$capitalized_name$Map() {\n"
        "  return internalGet$capitalized_name$().getMap();\n"
        "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "$deprecation$\n"
        "public $value_type$ get$capitalized_name$OrDefault(\n"
        "    $key_type$ key,\n"
        "    $value_type$ defaultValue) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$type_parameters$> map =\n"
        "      internalGet$capitalized_name$().getMap();\n"
        "  return map.containsKey(key) ? map.get(key) : defaultValue;\n"
        "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(
        variables_,
        "$deprecation$\n"
        "public $value_type$ get$capitalized_name$OrThrow(\n"
        "    $key_type$ key) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$type_parameters$> map =\n"
        "      internalGet$capitalized_name$().getMap();\n"
        "  if (!map.containsKey(key)) {\n"
        "    throw new java.lang.IllegalArgumentException();\n"
        "  }\n"
        "  return map.get(key);\n"
        "}\n");
  }
}